

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O1

void __thiscall
icu_63::DateTimePatternGenerator::setDecimalSymbols
          (DateTimePatternGenerator *this,Locale *locale,UErrorCode *status)

{
  DecimalFormatSymbols dfs;
  UnicodeString local_b50;
  undefined1 local_b10 [2816];
  
  DecimalFormatSymbols::DecimalFormatSymbols((DecimalFormatSymbols *)local_b10,locale,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    icu_63::UnicodeString::UnicodeString(&local_b50,(UnicodeString *)(local_b10 + 8));
    icu_63::UnicodeString::moveFrom(&this->decimal,&local_b50);
    icu_63::UnicodeString::~UnicodeString(&local_b50);
    icu_63::UnicodeString::getTerminatedBuffer(&this->decimal);
  }
  DecimalFormatSymbols::~DecimalFormatSymbols((DecimalFormatSymbols *)local_b10);
  return;
}

Assistant:

void
DateTimePatternGenerator::setDecimalSymbols(const Locale& locale, UErrorCode& status) {
    DecimalFormatSymbols dfs = DecimalFormatSymbols(locale, status);
    if(U_SUCCESS(status)) {
        decimal = dfs.getSymbol(DecimalFormatSymbols::kDecimalSeparatorSymbol);
        // NUL-terminate for the C API.
        decimal.getTerminatedBuffer();
    }
}